

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  size_t sVar1;
  void *dst;
  ulong uVar2;
  size_t sVar3;
  size_t err_code;
  size_t __size;
  
  if (srcSize < 0xff00ff00ff00ff00) {
    uVar2 = 0;
    if (srcSize < 0x20000) {
      uVar2 = -(srcSize - 0x20000) >> 0xb;
    }
    sVar1 = (srcSize >> 8) + srcSize + uVar2;
  }
  else {
    sVar1 = 0;
  }
  __size = 0xffffffffffffffb8;
  if (sVar1 != 0) {
    __size = sVar1;
  }
  dst = malloc(__size);
  if ((int)(zc->requestedParams).targetCBlockSize == 0) {
    if ((zc->requestedParams).nbWorkers == 0) {
      if (dst == (void *)0x0) {
        sVar3 = 0xffffffffffffffc0;
      }
      else {
        (zc->seqCollector).collectSequences = 1;
        (zc->seqCollector).seqStart = outSeqs;
        (zc->seqCollector).seqIndex = 0;
        (zc->seqCollector).maxSequences = outSeqsSize;
        sVar3 = ZSTD_compress2(zc,dst,__size,src,srcSize);
        free(dst);
        if (sVar3 < 0xffffffffffffff89) {
          sVar3 = (zc->seqCollector).seqIndex;
        }
      }
    }
    else {
      sVar3 = 0xffffffffffffffd8;
    }
  }
  else {
    sVar3 = 0xffffffffffffffd8;
  }
  return sVar3;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;
    {
        int targetCBlockSize;
        FORWARD_IF_ERROR(ZSTD_CCtx_getParameter(zc, ZSTD_c_targetCBlockSize, &targetCBlockSize), "");
        RETURN_ERROR_IF(targetCBlockSize != 0, parameter_unsupported, "targetCBlockSize != 0");
    }
    {
        int nbWorkers;
        FORWARD_IF_ERROR(ZSTD_CCtx_getParameter(zc, ZSTD_c_nbWorkers, &nbWorkers), "");
        RETURN_ERROR_IF(nbWorkers != 0, parameter_unsupported, "nbWorkers != 0");
    }

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    {
        const size_t ret = ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
        ZSTD_customFree(dst, ZSTD_defaultCMem);
        FORWARD_IF_ERROR(ret, "ZSTD_compress2 failed");
    }
    assert(zc->seqCollector.seqIndex <= ZSTD_sequenceBound(srcSize));
    return zc->seqCollector.seqIndex;
}